

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O3

ShuffleVectorInst * LLVMBC::dyn_cast<LLVMBC::ShuffleVectorInst>(Value *value)

{
  ValueKind VVar1;
  ShuffleVectorInst *this;
  ShuffleVectorInst *pSVar2;
  
  if (value != (Value *)0x0) {
    this = (ShuffleVectorInst *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)this);
    pSVar2 = (ShuffleVectorInst *)0x0;
    if (VVar1 == ShuffleVector) {
      pSVar2 = this;
    }
    return pSVar2;
  }
  return (ShuffleVectorInst *)0x0;
}

Assistant:

inline const T *dyn_cast(const Value *value)
{
	if (!value)
		return nullptr;

	if (T::get_value_kind() != ValueKind::Proxy)
		value = Internal::resolve_proxy(value);

	if (T::is_base_of_value_kind(value->get_value_kind()))
		return static_cast<const T *>(value);
	else
		return nullptr;
}